

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
utility::random_vector<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t size,int min,int max)

{
  anon_class_16_2_a39a3d48 __gen;
  iterator __first;
  size_type __n;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_48;
  default_random_engine generator;
  uniform_int_distribution<int> uniform;
  allocator<int> local_22;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int max_local;
  int min_local;
  size_t size_local;
  vector<int,_std::allocator<int>_> *numbers;
  
  local_21 = 0;
  local_20 = max;
  local_1c = min;
  _max_local = size;
  size_local = (size_t)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_22);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,size,&local_22);
  std::allocator<int>::~allocator(&local_22);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)((long)&generator._M_x + 4),local_1c,local_20);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_48);
  __first = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  __n = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  __gen.generator = &local_48;
  __gen.uniform = (uniform_int_distribution<int> *)((long)&generator._M_x + 4);
  std::
  generate_n<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_long,utility::random_vector<int>(unsigned_long,int,int)::_lambda()_1_>
            ((uchar *)__first._M_current,__n,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }